

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

void __thiscall wasm::Wasm2JSBuilder::freeTemp(Wasm2JSBuilder *this,Type type,IString temp)

{
  bool bVar1;
  mapped_type *this_00;
  Wasm2JSBuilder *this_local;
  IString temp_local;
  Type type_local;
  
  temp_local.str._M_len = (size_t)temp.str._M_str;
  this_local = (Wasm2JSBuilder *)temp.str._M_len;
  temp_local.str._M_str = (char *)type.id;
  bVar1 = wasm::Type::isTuple((Type *)&temp_local.str._M_str);
  if (bVar1) {
    __assert_fail("!type.isTuple() && \"Unexpected tuple type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm2js.h"
                  ,0xe8,"void wasm::Wasm2JSBuilder::freeTemp(Type, IString)");
  }
  this_00 = std::
            unordered_map<wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>_>
            ::operator[](&this->frees,(key_type *)&temp_local.str._M_str);
  std::vector<wasm::IString,_std::allocator<wasm::IString>_>::push_back
            (this_00,(value_type *)&this_local);
  return;
}

Assistant:

void freeTemp(Type type, IString temp) {
    // TODO: handle tuples
    assert(!type.isTuple() && "Unexpected tuple type");
    frees[type].push_back(temp);
  }